

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_CMP(Context *ctx)

{
  size_t in_RCX;
  size_t in_RDX;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char acStack_128 [64];
  char local_e8 [64];
  char local_a8 [64];
  char local_68 [64];
  
  make_ARB1_destarg_string(ctx,local_68,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_a8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_e8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,acStack_128,in_RCX);
  output_line(ctx,"CMP%s, %s, %s, %s;",local_68,local_a8,acStack_128,local_e8);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(TEXDEPTH)

static void emit_ARB1_CMP(Context *ctx)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
    // D3D tests (src0 >= 0.0), but ARB1 tests (src0 < 0.0) ... so just
    //  switch src1 and src2 to get the same results.
    output_line(ctx, "CMP%s, %s, %s, %s;", dst, src0, src2, src1);
    emit_ARB1_dest_modifiers(ctx);
}